

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::Framebuffer::Framebuffer
          (Framebuffer *this,Context *context,FboConfig *config,int width,int height,deUint32 fbo,
          deUint32 colorbuffer,deUint32 depthbuffer,deUint32 stencilbuffer)

{
  GLenum GVar1;
  deBool dVar2;
  deUint32 fbo_local;
  int height_local;
  int width_local;
  FboConfig *config_local;
  Context *context_local;
  Framebuffer *this_local;
  
  GVar1 = config->colorbufferFormat;
  (this->m_config).colorbufferType = config->colorbufferType;
  (this->m_config).colorbufferFormat = GVar1;
  GVar1 = config->depthbufferFormat;
  (this->m_config).depthbufferType = config->depthbufferType;
  (this->m_config).depthbufferFormat = GVar1;
  GVar1 = config->stencilbufferFormat;
  (this->m_config).stencilbufferType = config->stencilbufferType;
  (this->m_config).stencilbufferFormat = GVar1;
  this->m_context = context;
  this->m_framebuffer = fbo;
  this->m_colorbuffer = colorbuffer;
  this->m_depthbuffer = depthbuffer;
  this->m_stencilbuffer = stencilbuffer;
  checkColorFormatSupport(context,config->colorbufferFormat);
  if (this->m_framebuffer == 0) {
    (*context->_vptr_Context[10])(context,1,&this->m_framebuffer);
  }
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)this->m_framebuffer);
  GVar1 = (this->m_config).colorbufferType;
  if (GVar1 == 0xde1) {
    if (this->m_colorbuffer == 0) {
      (*context->_vptr_Context[7])(context,1,&this->m_colorbuffer);
    }
    (*context->_vptr_Context[6])(context,0xde1,(ulong)this->m_colorbuffer);
    (*context->_vptr_Context[0x7e])
              (context,0xde1,0,(ulong)(this->m_config).colorbufferFormat,(ulong)(uint)width,
               (ulong)(uint)height);
    (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
    dVar2 = ::deIsPowerOfTwo32(width);
    if ((dVar2 == 0) || (dVar2 = ::deIsPowerOfTwo32(height), dVar2 == 0)) {
      (*context->_vptr_Context[0x1d])(context,0xde1,0x2802,0x812f);
      (*context->_vptr_Context[0x1d])(context,0xde1,0x2803,0x812f);
    }
    (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)this->m_colorbuffer,0);
  }
  else if ((GVar1 != 0x8513) && (GVar1 == 0x8d41)) {
    createRbo(this,&this->m_colorbuffer,(this->m_config).colorbufferFormat,width,height);
    (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,(ulong)this->m_colorbuffer);
  }
  if ((this->m_config).depthbufferType == 0x8d41) {
    createRbo(this,&this->m_depthbuffer,(this->m_config).depthbufferFormat,width,height);
    (*context->_vptr_Context[0x20])(context,0x8d40,0x8d00,0x8d41,(ulong)this->m_depthbuffer);
  }
  if ((this->m_config).stencilbufferType == 0x8d41) {
    createRbo(this,&this->m_stencilbuffer,(this->m_config).stencilbufferFormat,width,height);
    (*context->_vptr_Context[0x20])(context,0x8d40,0x8d20,0x8d41,(ulong)this->m_stencilbuffer);
  }
  (*context->_vptr_Context[9])(context,0x8d40,0);
  return;
}

Assistant:

Framebuffer::Framebuffer (sglr::Context& context, const FboConfig& config, int width, int height, deUint32 fbo, deUint32 colorbuffer, deUint32 depthbuffer, deUint32 stencilbuffer)
	: m_config			(config)
	, m_context			(context)
	, m_framebuffer		(fbo)
	, m_colorbuffer		(colorbuffer)
	, m_depthbuffer		(depthbuffer)
	, m_stencilbuffer	(stencilbuffer)
{
	// Verify that color format is supported
	checkColorFormatSupport(context, config.colorbufferFormat);

	if (m_framebuffer == 0)
		context.genFramebuffers(1, &m_framebuffer);
	context.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	switch (m_config.colorbufferType)
	{
		case GL_TEXTURE_2D:
			if (m_colorbuffer == 0)
				context.genTextures(1, &m_colorbuffer);
			context.bindTexture(GL_TEXTURE_2D, m_colorbuffer);
			context.texImage2D(GL_TEXTURE_2D, 0, m_config.colorbufferFormat, width, height);
			context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);

			if (!deIsPowerOfTwo32(width) || !deIsPowerOfTwo32(height))
			{
				// Set wrap mode to clamp for NPOT FBOs
				context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
				context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
			}

			context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_colorbuffer, 0);
			break;

		case GL_TEXTURE_CUBE_MAP:
			DE_FATAL("TODO");
			break;

		case GL_RENDERBUFFER:
			createRbo(m_colorbuffer, m_config.colorbufferFormat, width, height);
			context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorbuffer);
			break;

		default:
			DE_ASSERT(m_config.colorbufferType == GL_NONE);
			break;
	}

	if (m_config.depthbufferType == GL_RENDERBUFFER)
	{
		createRbo(m_depthbuffer, m_config.depthbufferFormat, width, height);
		context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_depthbuffer);
	}
	else
		DE_ASSERT(m_config.depthbufferType == GL_NONE);

	if (m_config.stencilbufferType == GL_RENDERBUFFER)
	{
		createRbo(m_stencilbuffer, m_config.stencilbufferFormat, width, height);
		context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_stencilbuffer);
	}
	else
		DE_ASSERT(m_config.stencilbufferType == GL_NONE);

	context.bindFramebuffer(GL_FRAMEBUFFER, 0);
}